

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.h
# Opt level: O1

void __thiscall slang::ast::TypeArgFormatter::~TypeArgFormatter(TypeArgFormatter *this)

{
  value_type_pointer ppTVar1;
  FormatBuffer *__ptr;
  
  (this->super_DiagArgFormatter)._vptr_DiagArgFormatter =
       (_func_int **)&PTR__TypeArgFormatter_005e4f88;
  ppTVar1 = (this->typesToDisambiguate).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
            .arrays.elements_;
  if (ppTVar1 != (value_type_pointer)0x0) {
    operator_delete(ppTVar1,(this->typesToDisambiguate).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                            .arrays.groups_size_mask * 0x88 + 0x90);
  }
  ppTVar1 = (this->seenTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
            .arrays.elements_;
  if (ppTVar1 != (value_type_pointer)0x0) {
    operator_delete(ppTVar1,(this->seenTypes).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                            .arrays.groups_size_mask * 0x88 + 0x90);
  }
  __ptr = (this->printer).buffer._M_t.
          super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>._M_t
          .super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>.
          super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
  if (__ptr != (FormatBuffer *)0x0) {
    std::default_delete<slang::FormatBuffer>::operator()
              ((default_delete<slang::FormatBuffer> *)&(this->printer).buffer,__ptr);
  }
  (this->printer).buffer._M_t.
  super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>._M_t.
  super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>.
  super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl = (FormatBuffer *)0x0;
  operator_delete(this,0x80);
  return;
}

Assistant:

class SLANG_EXPORT TypeArgFormatter : public DiagArgFormatter {
public:
    /// Constructs a new type arg formatter.
    TypeArgFormatter();

    /// Set the options to use when formatting types.
    void setOptions(const TypePrintingOptions& options) { printer.options = options; }

    void startMessage(const Diagnostic& diag) final;
    std::string format(const std::any& arg) final;

private:
    TypePrinter printer;
    flat_hash_set<const Type*> seenTypes;
    flat_hash_set<const Type*> typesToDisambiguate;
}